

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress_bar.h
# Opt level: O2

void __thiscall OutputBox::OutputBox(OutputBox *this,string *title,uint bar_width,uint pre_spaces)

{
  string *__lhs;
  bool bVar1;
  uint uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (this->title_)._M_dataplus._M_p = (pointer)&(this->title_).field_2;
  (this->title_)._M_string_length = 0;
  (this->title_).field_2._M_local_buf[0] = '\0';
  (this->pb).post_message_._M_dataplus._M_p = (pointer)&(this->pb).post_message_.field_2;
  (this->pb).post_message_._M_string_length = 0;
  __lhs = &this->title_;
  (this->pb).post_message_.field_2._M_local_buf[0] = '\0';
  (this->pb).pre_message_._M_dataplus._M_p = (pointer)&(this->pb).pre_message_.field_2;
  (this->pb).pre_message_._M_string_length = 0;
  (this->pb).pre_message_.field_2._M_local_buf[0] = '\0';
  (this->pb).cur_test_ = 1;
  this->pre_spaces_ = pre_spaces;
  uVar2 = 0x50;
  if (bar_width < 0x50) {
    uVar2 = bar_width;
  }
  this->bar_width_ = uVar2 - pre_spaces;
  if ((ulong)((uVar2 - pre_spaces) - 4) < title->_M_string_length) {
    std::__cxx11::string::substr((ulong)&bStack_58,(ulong)title);
    std::operator+(&local_38,&bStack_58,"...");
    std::__cxx11::string::operator=((string *)__lhs,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&bStack_58);
  }
  else {
    std::__cxx11::string::_M_assign((string *)__lhs);
  }
  bVar1 = std::operator!=(__lhs,"");
  if (bVar1) {
    StreamDemultiplexer::operator<<((StreamDemultiplexer *)dmux::cout,(char (*) [2])0x2d7080);
    PrintSeparatorLine(this);
    PrintData(this,__lhs);
    PrintSeparatorLine(this);
  }
  return;
}

Assistant:

OutputBox(const std::string& title = "", 
        const unsigned bar_width = CONSOLE_WIDTH, 
        const unsigned pre_spaces = 2)
    {
        pre_spaces_ = pre_spaces;
        bar_width_ = bar_width > CONSOLE_WIDTH ? CONSOLE_WIDTH : bar_width;
        bar_width_ -= pre_spaces_;

        if (title.size() > bar_width_ - 4) {
            title_ = title.substr(0, bar_width_ - 4 - 3) + "...";
        }
        else {
            title_ = title;
        }
        //transform(title_.begin(), title_.end(), title_.begin(), ::toupper);

        if (title_ != "") {
            dmux::cout << "\n";
            PrintSeparatorLine();
            PrintData(title_);
            PrintSeparatorLine();
        }
    }